

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O0

LIST_ITEM_HANDLE singlylinkedlist_add(SINGLYLINKEDLIST_HANDLE list,void *item)

{
  LOGGER_LOG p_Var1;
  LIST_INSTANCE *list_instance;
  LOGGER_LOG l;
  LIST_ITEM_INSTANCE *result;
  void *item_local;
  SINGLYLINKEDLIST_HANDLE list_local;
  
  if ((list == (SINGLYLINKEDLIST_HANDLE)0x0) || (item == (void *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_add",0x42,1,"Invalid argument (list=%p, item=%p)",list,item);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0x10);
    if ((LIST_ITEM_INSTANCE *)l != (LIST_ITEM_INSTANCE *)0x0) {
      ((LIST_ITEM_INSTANCE *)l)->next = (void *)0x0;
      ((LIST_ITEM_INSTANCE *)l)->item = item;
      if (list->head == (LIST_ITEM_INSTANCE *)0x0) {
        list->head = (LIST_ITEM_INSTANCE *)l;
        list->tail = (LIST_ITEM_INSTANCE *)l;
      }
      else {
        list->tail->next = l;
        list->tail = (LIST_ITEM_INSTANCE *)l;
      }
    }
  }
  return (LIST_ITEM_HANDLE)l;
}

Assistant:

LIST_ITEM_HANDLE singlylinkedlist_add(SINGLYLINKEDLIST_HANDLE list, const void* item)
{
    LIST_ITEM_INSTANCE* result;

    /* Codes_SRS_LIST_01_006: [If any of the arguments is NULL, singlylinkedlist_add shall not add the item to the list and return NULL.] */
    if ((list == NULL) ||
        (item == NULL))
    {
        LogError("Invalid argument (list=%p, item=%p)", list, item);
        result = NULL;
    }
    else
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;
        result = (LIST_ITEM_INSTANCE*)malloc(sizeof(LIST_ITEM_INSTANCE));

        if (result == NULL)
        {
            /* Codes_SRS_LIST_01_007: [If allocating the new list node fails, singlylinkedlist_add shall return NULL.] */
            /*return as is*/
        }
        else
        {
            /* Codes_SRS_LIST_01_005: [singlylinkedlist_add shall add one item to the tail of the list and on success it shall return a handle to the added item.] */
            result->next = NULL;
            result->item = item;

            if (list_instance->head == NULL)
            {
                list_instance->head = result;
                list_instance->tail = result;
            }
            else
            {
                list_instance->tail->next = result;
                list_instance->tail = result;
            }
        }
    }

    return result;
}